

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

void __thiscall
VarnodeBank::VarnodeBank(VarnodeBank *this,AddrSpaceManager *m,AddrSpace *uspace,uintm ubase)

{
  Address local_38;
  uintm local_24;
  AddrSpace *pAStack_20;
  uintm ubase_local;
  AddrSpace *uspace_local;
  AddrSpaceManager *m_local;
  VarnodeBank *this_local;
  
  local_24 = ubase;
  pAStack_20 = uspace;
  uspace_local = (AddrSpace *)m;
  m_local = (AddrSpaceManager *)this;
  std::set<Varnode_*,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>::set(&this->loc_tree);
  std::set<Varnode_*,_VarnodeCompareDefLoc,_std::allocator<Varnode_*>_>::set(&this->def_tree);
  Address::Address(&local_38,m_minimal);
  Varnode::Varnode(&this->searchvn,0,&local_38,(Datatype *)0x0);
  this->manage = (AddrSpaceManager *)uspace_local;
  (this->searchvn).flags = 8;
  this->uniq_space = pAStack_20;
  this->uniqbase = local_24;
  this->uniqid = local_24;
  this->create_index = 0;
  return;
}

Assistant:

VarnodeBank::VarnodeBank(AddrSpaceManager *m,AddrSpace *uspace,uintm ubase)
  : searchvn(0,Address(Address::m_minimal),(Datatype *)0)

{
  manage = m;
  searchvn.flags = Varnode::input; // searchvn is always an input varnode of size 0
  uniq_space = uspace;
  uniqbase = ubase;
  uniqid = ubase;
  create_index = 0;
}